

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

ON_Quaternion *
ON_Quaternion::Slerp
          (ON_Quaternion *__return_storage_ptr__,ON_Quaternion q0,ON_Quaternion q1,double t)

{
  ON_Quaternion *this;
  ON_Quaternion local_60;
  ON_Quaternion local_40;
  
  this = &q0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 0.0;
  __return_storage_ptr__->a = 0.0;
  __return_storage_ptr__->b = 0.0;
  if (t <= 0.5) {
    Inverse(&local_60,this);
    operator*(__return_storage_ptr__,&local_60,&q1);
    Pow(&local_40,*__return_storage_ptr__,t);
  }
  else {
    Inverse(&local_60,&q1);
    operator*(__return_storage_ptr__,&local_60,this);
    Pow(&local_40,*__return_storage_ptr__,1.0 - t);
    this = &q1;
  }
  operator*(&local_60,this,&local_40);
  __return_storage_ptr__->c = local_60.c;
  __return_storage_ptr__->d = local_60.d;
  __return_storage_ptr__->a = local_60.a;
  __return_storage_ptr__->b = local_60.b;
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_Quaternion::Slerp(ON_Quaternion q0, ON_Quaternion q1, double t)
{
  ON_Quaternion q;
  if ( t <= 0.5 )
  {
    q = q0.Inverse()*q1;
    q = q0*ON_Quaternion::Pow(q,t);
  }
  else
  {
    q = q1.Inverse()*q0;
    q = q1*ON_Quaternion::Pow(q,1.0-t);
  }
  return q;
}